

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifask(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  runcxdef *prVar5;
  int32_t tmp_1;
  bool bVar6;
  bool bVar7;
  uint16_t tmp;
  os_filetype_t file_type;
  uint siz;
  char **ppcVar8;
  bool bVar9;
  runsdef val;
  runsdef val2;
  char pbuf [128];
  char buf [4098];
  runsdef local_10d8;
  runsdef local_10c8;
  char local_10b8 [128];
  char local_1038 [4104];
  
  if ((1 < argc - 3U) && (argc != 1)) {
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x401);
  }
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  if (prVar1[-1].runstyp != '\x03') {
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  bifcstr(ctx,local_10b8,0x80,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
  if (argc < 3) {
    pcVar3 = bif_stristr(local_10b8,"save");
    iVar2 = 2;
    bVar6 = true;
    if (pcVar3 == (char *)0x0) {
      ppcVar8 = bifask::save_strs;
      do {
        ppcVar8 = ppcVar8 + 1;
        pcVar3 = *ppcVar8;
        bVar7 = pcVar3 != (char *)0x0;
        if (pcVar3 == (char *)0x0) {
          iVar2 = 1;
          break;
        }
        pcVar3 = bif_stristr(local_10b8,pcVar3);
      } while (pcVar3 == (char *)0x0);
    }
    else {
      bVar7 = true;
    }
    pcVar3 = bif_stristr(local_10b8,"restore");
    file_type = 0xb;
    if (pcVar3 != (char *)0x0) {
      ppcVar8 = bifask::game_strs;
      do {
        ppcVar8 = ppcVar8 + 1;
        pcVar3 = *ppcVar8;
        bVar6 = pcVar3 != (char *)0x0;
        if (pcVar3 == (char *)0x0) {
          file_type = 1;
          break;
        }
        pcVar3 = bif_stristr(local_10b8,pcVar3);
      } while (pcVar3 != (char *)0x0);
    }
    bVar9 = true;
    if ((bool)(bVar7 & bVar6)) {
      pcVar3 = bif_stristr(local_10b8,"script");
      file_type = (uint)(pcVar3 == (char *)0x0) * 9 + 2;
    }
    goto LAB_00124524;
  }
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  prVar5 = ctx->bifcxrun;
  if (prVar1[-1].runstyp == '\x01') {
    prVar1 = prVar5->runcxsp;
    iVar2 = *(int *)&prVar1->runsv;
    prVar5->runcxsp = prVar1 + -1;
    prVar5 = ctx->bifcxrun;
    if (prVar1[-1].runstyp == '\x01') {
      prVar1 = prVar5->runcxsp;
      file_type = *(os_filetype_t *)&prVar1->runsv;
      bVar9 = true;
      if (argc == 4) {
        prVar5->runcxsp = prVar1 + -1;
        prVar5 = ctx->bifcxrun;
        if (prVar1[-1].runstyp != '\x01') goto LAB_00124695;
        bVar9 = ((ulong)prVar5->runcxsp->runsv & 1) == 0;
      }
LAB_00124524:
      iVar2 = tio_askfile(local_10b8,local_1038,0x1002,iVar2,file_type);
      if (bVar9) {
        prVar5 = ctx->bifcxrun;
        if (iVar2 == 0) {
          sVar4 = strlen(local_1038);
          runpushcstr(prVar5,local_1038,sVar4,0);
        }
        else {
          runpnil(prVar5);
        }
      }
      else {
        siz = 8 - (iVar2 == 0);
        prVar5 = ctx->bifcxrun;
        if ((uint)(*(int *)&prVar5->runcxhtop - *(int *)&prVar5->runcxhp) <= siz) {
          runhcmp(prVar5,siz,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
        }
        local_10d8.runstyp = '\a';
        local_10d8.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
        *(short *)local_10d8.runsv.runsvstr = (short)siz;
        *(uchar *)(local_10d8.runsv.runsvnum + 2) = '\x01';
        *(int *)(local_10d8.runsv.runsvnum + 3) = iVar2;
        if (iVar2 == 0) {
          ctx->bifcxrun->runcxhp = (uchar *)(local_10d8.runsv.runsvnum + 7);
          runrepush(ctx->bifcxrun,&local_10d8);
          prVar5 = ctx->bifcxrun;
          sVar4 = strlen(local_1038);
          runpushcstr(prVar5,local_1038,sVar4,1);
          prVar1 = ctx->bifcxrun->runcxsp;
          ctx->bifcxrun->runcxsp = prVar1 + -1;
          local_10c8.runstyp = prVar1[-1].runstyp;
          local_10c8._1_7_ = *(undefined7 *)&prVar1[-1].field_0x1;
          local_10c8.runsv = prVar1[-1].runsv;
          prVar1 = ctx->bifcxrun->runcxsp;
          ctx->bifcxrun->runcxsp = prVar1 + -1;
          local_10d8.runstyp = prVar1[-1].runstyp;
          local_10d8._1_7_ = *(undefined7 *)&prVar1[-1].field_0x1;
          local_10d8.runsv = prVar1[-1].runsv;
          runadd(ctx->bifcxrun,&local_10d8,&local_10c8,2);
          prVar5 = ctx->bifcxrun;
        }
        else {
          *(uchar *)(local_10d8.runsv.runsvnum + 7) = '\x05';
          ctx->bifcxrun->runcxhp = (uchar *)(local_10d8.runsv.runsvnum + 8);
          prVar5 = ctx->bifcxrun;
        }
        runrepush(prVar5,&local_10d8);
      }
      return;
    }
  }
LAB_00124695:
  prVar5->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3eb);
}

Assistant:

void bifask(bifcxdef *ctx, int argc)
{
    uchar *prompt;
    char   buf[OSFNMAX + 2];
    char   pbuf[128];
    int    err;
    int    prompt_type;
    int    file_type;
    ulong  flags;

    /* make sure we have an acceptable number of arguments */
    if (argc != 1 && argc != 3 && argc != 4)
        runsig(ctx->bifcxrun, ERR_BIFARGC);

    /* get the first argument - the prompt string */
    prompt = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, pbuf, (size_t)sizeof(pbuf), prompt);

    /* presume we will have no flags */
    flags = 0;

    /* if we have the prompt type and file type parameters, get them */
    if (argc >= 3)
    {
        /* get the prompt-type and the file-type arguments */
        prompt_type = (int)runpopnum(ctx->bifcxrun);
        file_type = (int)runpopnum(ctx->bifcxrun);

        /* if we have a fourth argument, it's the flags */
        if (argc == 4)
            flags = runpopnum(ctx->bifcxrun);
    }
    else
    {
        static const char *save_strs[] =
        {
            "save",
            "write",
            0
        };
        static const char *game_strs[] =
        {
            "restore",
            "game",
            0
        };
        const char **sp;

        /* 
         *   No prompt type or file type were specified.  Try to infer the
         *   dialog type and file type from the text of the prompt.  (This
         *   is mostly to support older games, in particular those based
         *   on older versions of adv.t, since newer games should always
         *   provide explicit values for the file type and dialog type.
         *   We are thus inferring the types based on the prompt strings
         *   that older adv.t's used when calling askfile.)
         *   
         *   If the prompt contains any substring such as "save" or
         *   "write", specify that we're saving; otherwise, assume that
         *   we're opening an existing file for reading.
         *   
         *   If the prompt contains the substrings "restore" AND "game",
         *   assume that we're opening a game file; otherwise, don't make
         *   any assumptions, and use the "unknown" file type.  
         */

        /* presume we're going to open a saved-game file */
        prompt_type = OS_AFP_OPEN;
        file_type = OSFTSAVE;

        /* look for any one of the "save" substrings */
        for (sp = save_strs ; *sp != 0 ; ++sp)
        {
            /* check to see if this substring matches */
            if (bif_stristr(pbuf, *sp))
            {
                /* found it - use the "save" prompt */
                prompt_type = OS_AFP_SAVE;

                /* no need to look any further */
                break;
            }
        }

        /* 
         *   look for *all* of the "restore game" strings - if we fail to
         *   find any of them, be conservative and make no assumptions
         *   about the file type 
         */
        for (sp = game_strs ; *sp != 0 ; ++sp)
        {
            if (bif_stristr(pbuf, *sp) == 0)
            {
                /* 
                 *   this one doesn't match - don't make assumptions about
                 *   the file type 
                 */
                file_type = OSFTUNK;

                /* no need to look any further */
                break;
            }
        }

        /* check for a transcript */
        if (file_type == OSFTUNK
            && prompt_type == OS_AFP_SAVE
            && bif_stristr(pbuf, "script") != 0)
        {
            /* looks like a log file */
            file_type = OSFTLOG;
        }
    }

    /* ask for a file */
    err = tio_askfile(pbuf, buf, (int)sizeof(buf), prompt_type, file_type);

    /* 
     *   if the caller requested extended return codes, return a list
     *   containing the return code as the first element and, if
     *   successful, the string as the second element 
     */
    if ((flags & BIF_ASKF_EXT_RET) != 0)
    {
        ushort len;
        runsdef val;
        uchar *p;
        
        /* 
         *   Allocate space for the starter list - if we have a string to
         *   return, just allocate space for the number element for now;
         *   otherwise, allocate space for the number plus a nil second
         *   element (one byte).
         */
        len = 2 + (1 + 4);
        if (err != OS_AFE_SUCCESS)
            ++len;

        /* allocate the space */
        runhres(ctx->bifcxrun, len, 0);

        /* set up our list pointer */
        val.runstyp = DAT_LIST;
        val.runsv.runsvstr = p = ctx->bifcxrun->runcxhp;

        /* write the length prefix */
        oswp2(p, len);
        p += 2;

        /* write the return code as the first element */
        *p++ = DAT_NUMBER;
        oswp4s(p, err);
        p += 4;

        /* write the 'nil' second element if there's an error */
        if (err != OS_AFE_SUCCESS)
            *p++ = DAT_NIL;

        /* commit the list's memory */
        ctx->bifcxrun->runcxhp = p;

        /* push the list */
        runrepush(ctx->bifcxrun, &val);

        /* if we were successful, add the string to the list */
        if (err == OS_AFE_SUCCESS)
        {
            runsdef val2;
            
            /* push the string value, converting to our string format */
            runpushcstr(ctx->bifcxrun, buf, strlen(buf), 1);

            /* add it to the list already on the stack */
            runpop(ctx->bifcxrun, &val2);
            runpop(ctx->bifcxrun, &val);
            runadd(ctx->bifcxrun, &val, &val2, 2);

            /* re-push the result */
            runrepush(ctx->bifcxrun, &val);
        }
    }
    else
    {
        /* 
         *   use the traditional return codes - if askfile failed, return
         *   nil; otherwise, return the filename 
         */
        if (err)
            runpnil(ctx->bifcxrun);
        else
            runpushcstr(ctx->bifcxrun, buf, strlen(buf), 0);
    }
}